

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall kratos::StubGeneratorVisitor::visit(StubGeneratorVisitor *this,Generator *generator)

{
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  Generator *this_00;
  bool bVar1;
  PortDirection PVar2;
  int iVar3;
  uint32_t width;
  uint64_t uVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  VarException *pVVar7;
  undefined4 extraout_var_00;
  element_type *peVar8;
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar9 [16];
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  undefined1 local_418 [38];
  undefined1 local_3f2;
  allocator<const_kratos::IRNode_*> local_3f1;
  element_type *local_3f0;
  Generator *local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_3e0;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_3d0;
  string local_3b8;
  undefined1 local_392;
  allocator<const_kratos::IRNode_*> local_391;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_380;
  pointer local_378;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_370;
  string local_358;
  undefined1 local_338 [8];
  shared_ptr<kratos::Port> port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_300;
  __node_base_ptr local_2f0;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_2e8;
  string local_2d0;
  undefined1 local_2b0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ports;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vars;
  string local_258;
  Generator *local_238;
  Generator *generator_local;
  StubGeneratorVisitor *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_220;
  basic_string_view<char> local_218;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_208;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_1f0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *vargs;
  string *local_1e0;
  undefined1 local_1d8 [24];
  _Base_ptr local_1c0;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_1b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_1a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  __node_base local_198;
  string *local_190;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_188;
  basic_string_view<char> local_178;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  string *local_130;
  __buckets_ptr local_128;
  string *local_120;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_118;
  _Prime_rehash_policy local_108;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  string *local_c0;
  char *local_b8;
  string *local_b0;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_a8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a0;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_98;
  __node_base local_90;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_80;
  Generator *local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_70;
  Generator *local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  __node_base local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_238 = generator;
  generator_local = (Generator *)this;
  bVar1 = Generator::is_stub(generator);
  if (bVar1) {
    uVar4 = Generator::stmts_count(local_238);
    if (uVar4 != 0) {
      auVar9 = __cxa_allocate_exception(0x10);
      local_1e0 = &local_258;
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               *)anon_var_dwarf_6a045f;
      local_208.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<,char[48],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)"{0} is marked as a stub but contains statements",(v7 *)generator,
                      auVar9._8_8_);
      local_1f0 = &local_208;
      local_218 = fmt::v7::to_string_view<char,_0>((char *)vargs);
      local_a0 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&this_local;
      local_a8 = local_1f0;
      local_98 = local_1f0;
      local_88 = local_1f0;
      local_90._M_nxt = (_Hash_node_base *)local_a0;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_a0,0,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_1f0->string);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_220.values_;
      format_str.size_ = (size_t)this_local;
      format_str.data_ = (char *)local_218.size_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_258,(detail *)local_218.data_,format_str,args);
      std::runtime_error::runtime_error(auVar9._0_8_,(string *)&local_258);
      __cxa_throw(auVar9._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Generator::get_vars_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,local_238);
    psVar5 = Generator::get_port_names_abi_cxx11_(local_238);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_2b0,psVar5);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (!bVar1) {
      __range2._6_1_ = 1;
      auVar9 = __cxa_allocate_exception(0x10);
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_238->name;
      local_190 = &local_2d0;
      local_198._M_nxt = (_Hash_node_base *)0x4666bc;
      local_1b8.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<std::__cxx11::string&,char[51],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)"{0} is declared as stub but has declared variables",(v7 *)vargs_1,
                      auVar9._8_8_,
                      (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                      "{0} is declared as stub but has declared variables");
      local_1a8 = &local_1b8;
      join_0x00000010_0x00000000_ = fmt::v7::to_string_view<char,_0>((char *)local_198._M_nxt);
      local_78 = (Generator *)local_1d8;
      local_80 = local_1a8;
      local_70 = local_1a8;
      local_60 = local_1a8;
      local_68 = local_78;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_78,0xd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_1a8->string);
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = local_1d8._8_8_;
      format_str_00.size_ = local_1d8._0_8_;
      format_str_00.data_ = (char *)local_1c0;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_2d0,(detail *)local_1d8._16_8_,format_str_00,args_00);
      local_300._M_allocated_capacity = (size_type)local_238;
      local_300._8_8_ = &local_300;
      local_2f0 = (__node_base_ptr)0x1;
      std::allocator<kratos::IRNode_*>::allocator
                ((allocator<kratos::IRNode_*> *)((long)&__range2 + 7));
      __l_01._M_len = (size_type)local_2f0;
      __l_01._M_array = (iterator)local_300._8_8_;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                (&local_2e8,__l_01,(allocator<kratos::IRNode_*> *)((long)&__range2 + 7));
      GeneratorException::GeneratorException(auVar9._0_8_,&local_2d0,&local_2e8);
      __range2._6_1_ = 0;
      __cxa_throw(auVar9._0_8_,&GeneratorException::typeinfo,GeneratorException::~GeneratorException
                 );
    }
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2b0);
    port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2b0);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&port_name), bVar1) {
      port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end2);
      Generator::get_port((Generator *)local_338,(string *)local_238);
      peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_338);
      PVar2 = Port::port_direction(peVar6);
      if (PVar2 == In) {
        peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_338);
        iVar3 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0xe])();
        bVar1 = std::
                unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                ::empty((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                         *)CONCAT44(extraout_var,iVar3));
        if (!bVar1) {
          local_392 = 1;
          pVVar7 = (VarException *)__cxa_allocate_exception(0x10);
          local_130 = &local_238->name;
          local_120 = &local_358;
          local_128 = (__buckets_ptr)0x4666ef;
          vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi;
          fmt::v7::
          make_args_checked<std::__cxx11::string&,std::__cxx11::string_const&,char[56],char>
                    (&local_168,(v7 *)"{0}.{1} is driving a net, but {0} is declared as a stub",
                     (char (*) [56])local_130,
                     (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi,in_R8);
          local_140 = &local_168;
          local_178 = fmt::v7::to_string_view<char,_0>((char *)local_128);
          local_40 = &local_188;
          local_48._M_nxt = (_Hash_node_base *)local_140;
          local_38 = local_140;
          local_28 = local_140;
          local_30 = local_40;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_40,0xdd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_140);
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_188.field_1.values_;
          format_str_01.size_ = local_188.desc_;
          format_str_01.data_ = (char *)local_178.size_;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_358,(detail *)local_178.data_,format_str_01,args_01);
          local_390._M_allocated_capacity =
               (size_type)
               std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_338);
          local_390._8_8_ = local_238;
          local_380 = &local_390;
          local_378 = (pointer)0x2;
          std::allocator<const_kratos::IRNode_*>::allocator(&local_391);
          __l_00._M_len = (size_type)local_378;
          __l_00._M_array = (iterator)local_380;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_370,__l_00,&local_391);
          VarException::VarException(pVVar7,&local_358,&local_370);
          local_392 = 0;
          __cxa_throw(pVVar7,&VarException::typeinfo,VarException::~VarException);
        }
      }
      else {
        peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_338);
        iVar3 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0x10])();
        bVar1 = std::
                unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                ::empty((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                         *)CONCAT44(extraout_var_00,iVar3));
        this_00 = local_238;
        if (!bVar1) {
          local_3f2 = 1;
          pVVar7 = (VarException *)__cxa_allocate_exception(0x10);
          local_c0 = &local_238->name;
          local_b0 = &local_3b8;
          local_b8 = "{0}.{1} is driven by a net, but {0} is declared as a stub";
          vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi;
          fmt::v7::
          make_args_checked<std::__cxx11::string&,std::__cxx11::string_const&,char[58],char>
                    (&local_f8,(v7 *)"{0}.{1} is driven by a net, but {0} is declared as a stub",
                     (char (*) [58])local_c0,
                     (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi,in_R8);
          local_d0 = &local_f8;
          local_108 = (_Prime_rehash_policy)fmt::v7::to_string_view<char,_0>(local_b8);
          local_50 = &local_118;
          local_58 = local_d0;
          local_20 = local_d0;
          local_10 = local_d0;
          local_18 = local_50;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_50,0xdd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_d0);
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_118.field_1.values_;
          format_str_02.size_ = local_118.desc_;
          format_str_02.data_ = (char *)local_108._M_next_resize;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_3b8,(detail *)local_108._0_8_,format_str_02,args_02);
          local_3f0 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_338
                                );
          local_3e8 = local_238;
          local_3e0._M_allocated_capacity = (size_type)&local_3f0;
          local_3e0._8_8_ = 2;
          std::allocator<const_kratos::IRNode_*>::allocator(&local_3f1);
          __l._M_len = local_3e0._8_8_;
          __l._M_array = (iterator)local_3e0._M_allocated_capacity;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_3d0,__l,&local_3f1);
          VarException::VarException(pVVar7,&local_3b8,&local_3d0);
          local_3f2 = 0;
          __cxa_throw(pVVar7,&VarException::typeinfo,VarException::~VarException);
        }
        peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_338);
        peVar8 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_338);
        width = (*(peVar8->super_Var).super_IRNode._vptr_IRNode[7])();
        constant(0,width,false);
        Var::assign((Var *)local_418,&peVar6->super_Var);
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                  ((shared_ptr<kratos::Stmt> *)(local_418 + 0x10),
                   (shared_ptr<kratos::AssignStmt> *)local_418);
        Generator::add_stmt(this_00,(shared_ptr<kratos::Stmt> *)(local_418 + 0x10));
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_418 + 0x10));
        std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                  ((shared_ptr<kratos::AssignStmt> *)local_418);
      }
      std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_338);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (!generator->is_stub()) return;
        // to be a stub, there shouldn't be any extra variables
        if (generator->stmts_count() > 0) {
            throw ::runtime_error(::format("{0} is marked as a stub but contains statements"));
        }

        // has to be the exact same number of ports and vars, otherwise it means there are
        // some variables being declared
        auto vars = generator->get_vars();
        auto ports = generator->get_port_names();
        if (!vars.empty()) {
            throw GeneratorException(
                fmt::format("{0} is declared as stub but has declared variables", generator->name),
                {generator});
        }

        for (auto const& port_name : ports) {
            auto port = generator->get_port(port_name);
            if (port->port_direction() == PortDirection::In) {
                if (!port->sinks().empty())
                    throw VarException(
                        fmt::format("{0}.{1} is driving a net, but {0} is declared as a stub",
                                    generator->name, port_name),
                        {port.get(), generator});
            } else {
                if (!port->sources().empty())
                    throw VarException(
                        fmt::format("{0}.{1} is driven by a net, but {0} is declared as a stub",
                                    generator->name, port_name),
                        {port.get(), generator});
                generator->add_stmt(port->assign(constant(0, port->width())));
            }
        }
    }